

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp.cc
# Opt level: O2

int main(int argc,char **argv)

{
  undefined4 uVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  ostream *poVar5;
  long *plVar6;
  uint uVar7;
  char **ppcVar8;
  ifstream *this;
  long lVar9;
  char *pcVar10;
  char *pcVar11;
  bool bVar12;
  allocator local_41d;
  int maximum_index;
  string local_418;
  string data_type;
  ostringstream error_message_5;
  size_type local_3c8;
  string print_format;
  ifstream ifs;
  byte abStack_218 [488];
  
  maximum_index = -1;
  std::__cxx11::string::string((string *)&print_format,"",(allocator *)&ifs);
  std::__cxx11::string::string((string *)&data_type,"d",(allocator *)&ifs);
  uVar1 = 0;
LAB_001035ec:
  do {
    iVar4 = ya_getopt_long(argc,argv,"l:m:f:h",(option *)0x0,(int *)0x0);
    switch(iVar4) {
    case 0x66:
      std::__cxx11::string::assign((char *)&print_format);
      std::__cxx11::string::substr((ulong)&ifs,(ulong)&print_format);
      bVar2 = std::operator!=("%",(string *)&ifs);
      std::__cxx11::string::~string((string *)&ifs);
      if (bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        poVar5 = std::operator<<((ostream *)&ifs,
                                 "The argument for the -f option must be begin with ");
        std::operator<<(poVar5,"%");
        std::__cxx11::string::string((string *)&error_message_5,"dmp",(allocator *)&local_418);
        sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
        goto LAB_001039b2;
      }
      break;
    case 0x68:
      uVar7 = 0;
      anon_unknown.dwarf_1eab::PrintUsage((ostream *)&std::cout);
      goto LAB_001039cc;
    case 0x6c:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_5);
      bVar12 = sptk::ConvertStringToInteger((string *)&ifs,&maximum_index);
      bVar2 = maximum_index < 1;
      std::__cxx11::string::~string((string *)&ifs);
      uVar1 = 1;
      if (!bVar12 || bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -l option must be a positive integer")
        ;
        std::__cxx11::string::string((string *)&error_message_5,"dmp",(allocator *)&local_418);
        sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
        goto LAB_001039b2;
      }
      break;
    case 0x6d:
      goto switchD_00103615_caseD_6d;
    default:
      if (iVar4 == -1) {
        lVar9 = (long)(argc - ya_optind);
        ppcVar8 = argv + (argc - lVar9);
        pcVar11 = (char *)0x0;
        goto LAB_00103798;
      }
    case 0x67:
    case 0x69:
    case 0x6a:
    case 0x6b:
      anon_unknown.dwarf_1eab::PrintUsage((ostream *)&std::cerr);
      goto LAB_001039c9;
    }
  } while( true );
LAB_00103798:
  if (lVar9 < 1) goto LAB_0010387b;
  pcVar10 = *ppcVar8;
  if (*pcVar10 == '+') {
    std::__cxx11::string::string((string *)&ifs,pcVar10,(allocator *)&error_message_5);
    std::__cxx11::string::substr((ulong)&error_message_5,(ulong)&ifs);
    std::__cxx11::string::operator=((string *)&data_type,(string *)&error_message_5);
    std::__cxx11::string::~string((string *)&error_message_5);
    std::__cxx11::string::~string((string *)&ifs);
    pcVar10 = pcVar11;
  }
  else if (pcVar11 != (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    std::operator<<((ostream *)&ifs,"Too many input files");
    std::__cxx11::string::string((string *)&error_message_5,"dmp",(allocator *)&local_418);
    sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
    goto LAB_001039b2;
  }
  lVar9 = lVar9 + -1;
  ppcVar8 = ppcVar8 + 1;
  pcVar11 = pcVar10;
  goto LAB_00103798;
LAB_0010387b:
  bVar2 = sptk::SetBinaryMode();
  if (bVar2) {
    this = &ifs;
    std::ifstream::ifstream(this);
    if ((pcVar11 == (char *)0x0) ||
       (std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar11),
       (abStack_218[*(long *)(_ifs + -0x18)] & 5) == 0)) {
      cVar3 = std::__basic_file<char>::is_open();
      iVar4 = maximum_index;
      if (cVar3 == '\0') {
        this = (ifstream *)&std::cin;
      }
      std::__cxx11::string::string((string *)&error_message_5,(string *)&print_format);
      bVar2 = std::operator==("c",&data_type);
      if (bVar2) {
        if (local_3c8 == 0) {
          std::__cxx11::string::assign((char *)&error_message_5);
        }
        plVar6 = (long *)operator_new(0x30);
        *plVar6 = (long)&PTR__DataDump_001129b0;
        std::__cxx11::string::string((string *)(plVar6 + 1),(string *)&error_message_5);
LAB_00103ef8:
        *(undefined4 *)(plVar6 + 5) = uVar1;
        *(int *)((long)plVar6 + 0x2c) = iVar4;
      }
      else {
        bVar2 = std::operator==("s",&data_type);
        if (bVar2) {
          if (local_3c8 == 0) {
            std::__cxx11::string::assign((char *)&error_message_5);
          }
          plVar6 = (long *)operator_new(0x30);
          *plVar6 = (long)&PTR__DataDump_00112a00;
          std::__cxx11::string::string((string *)(plVar6 + 1),(string *)&error_message_5);
          goto LAB_00103ef8;
        }
        bVar2 = std::operator==("h",&data_type);
        if (bVar2) {
          if (local_3c8 == 0) {
            std::__cxx11::string::assign((char *)&error_message_5);
          }
          plVar6 = (long *)operator_new(0x30);
          *plVar6 = (long)&PTR__DataDump_00112a40;
          std::__cxx11::string::string((string *)(plVar6 + 1),(string *)&error_message_5);
          goto LAB_00103ef8;
        }
        bVar2 = std::operator==("i",&data_type);
        if (bVar2) {
          if (local_3c8 == 0) {
            std::__cxx11::string::assign((char *)&error_message_5);
          }
          plVar6 = (long *)operator_new(0x30);
          *plVar6 = (long)&PTR__DataDump_00112a80;
          std::__cxx11::string::string((string *)(plVar6 + 1),(string *)&error_message_5);
          goto LAB_00103ef8;
        }
        bVar2 = std::operator==("l",&data_type);
        if (bVar2) {
          if (local_3c8 == 0) {
            std::__cxx11::string::assign((char *)&error_message_5);
          }
          plVar6 = (long *)operator_new(0x30);
          *plVar6 = (long)&PTR__DataDump_00112ac0;
          std::__cxx11::string::string((string *)(plVar6 + 1),(string *)&error_message_5);
          goto LAB_00103ef8;
        }
        bVar2 = std::operator==("C",&data_type);
        if (bVar2) {
          if (local_3c8 == 0) {
            std::__cxx11::string::assign((char *)&error_message_5);
          }
          plVar6 = (long *)operator_new(0x30);
          *plVar6 = (long)&PTR__DataDump_00112b00;
          std::__cxx11::string::string((string *)(plVar6 + 1),(string *)&error_message_5);
          goto LAB_00103ef8;
        }
        bVar2 = std::operator==("S",&data_type);
        if (bVar2) {
          if (local_3c8 == 0) {
            std::__cxx11::string::assign((char *)&error_message_5);
          }
          plVar6 = (long *)operator_new(0x30);
          *plVar6 = (long)&PTR__DataDump_00112b40;
          std::__cxx11::string::string((string *)(plVar6 + 1),(string *)&error_message_5);
          goto LAB_00103ef8;
        }
        bVar2 = std::operator==("H",&data_type);
        if (bVar2) {
          if (local_3c8 == 0) {
            std::__cxx11::string::assign((char *)&error_message_5);
          }
          plVar6 = (long *)operator_new(0x30);
          *plVar6 = (long)&PTR__DataDump_00112b80;
          std::__cxx11::string::string((string *)(plVar6 + 1),(string *)&error_message_5);
          goto LAB_00103ef8;
        }
        bVar2 = std::operator==("I",&data_type);
        if (bVar2) {
          if (local_3c8 == 0) {
            std::__cxx11::string::assign((char *)&error_message_5);
          }
          plVar6 = (long *)operator_new(0x30);
          *plVar6 = (long)&PTR__DataDump_00112bc0;
          std::__cxx11::string::string((string *)(plVar6 + 1),(string *)&error_message_5);
          goto LAB_00103ef8;
        }
        bVar2 = std::operator==("L",&data_type);
        if (bVar2) {
          if (local_3c8 == 0) {
            std::__cxx11::string::assign((char *)&error_message_5);
          }
          plVar6 = (long *)operator_new(0x30);
          *plVar6 = (long)&PTR__DataDump_00112c00;
          std::__cxx11::string::string((string *)(plVar6 + 1),(string *)&error_message_5);
          goto LAB_00103ef8;
        }
        bVar2 = std::operator==("f",&data_type);
        if (bVar2) {
          if (local_3c8 == 0) {
            std::__cxx11::string::assign((char *)&error_message_5);
          }
          plVar6 = (long *)operator_new(0x30);
          *plVar6 = (long)&PTR__DataDump_00112c40;
          std::__cxx11::string::string((string *)(plVar6 + 1),(string *)&error_message_5);
          goto LAB_00103ef8;
        }
        bVar2 = std::operator==("d",&data_type);
        if (bVar2) {
          if (local_3c8 == 0) {
            std::__cxx11::string::assign((char *)&error_message_5);
          }
          plVar6 = (long *)operator_new(0x30);
          *plVar6 = (long)&PTR__DataDump_00112c80;
          std::__cxx11::string::string((string *)(plVar6 + 1),(string *)&error_message_5);
          goto LAB_00103ef8;
        }
        bVar2 = std::operator==("e",&data_type);
        if (bVar2) {
          if (local_3c8 == 0) {
            std::__cxx11::string::assign((char *)&error_message_5);
          }
          plVar6 = (long *)operator_new(0x30);
          *plVar6 = (long)&PTR__DataDump_00112cc0;
          std::__cxx11::string::string((string *)(plVar6 + 1),(string *)&error_message_5);
          goto LAB_00103ef8;
        }
        plVar6 = (long *)0x0;
      }
      std::__cxx11::string::~string((string *)&error_message_5);
      if (plVar6 == (long *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
        std::operator<<((ostream *)&error_message_5,"Unexpected argument for the +type option");
        std::__cxx11::string::string((string *)&local_418,"dmp",&local_41d);
        sptk::PrintErrorMessage(&local_418,&error_message_5);
        goto LAB_00103fc8;
      }
      cVar3 = (**(code **)(*plVar6 + 0x10))(plVar6,this);
      if (cVar3 == '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
        std::operator<<((ostream *)&error_message_5,"Failed to dump");
        std::__cxx11::string::string((string *)&local_418,"dmp",&local_41d);
        sptk::PrintErrorMessage(&local_418,&error_message_5);
        std::__cxx11::string::~string((string *)&local_418);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_5);
      }
      uVar7 = (uint)(cVar3 == '\0');
      (**(code **)(*plVar6 + 8))(plVar6);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_5);
      poVar5 = std::operator<<((ostream *)&error_message_5,"Cannot open file ");
      std::operator<<(poVar5,pcVar11);
      std::__cxx11::string::string((string *)&local_418,"dmp",&local_41d);
      sptk::PrintErrorMessage(&local_418,&error_message_5);
LAB_00103fc8:
      std::__cxx11::string::~string((string *)&local_418);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_5);
      uVar7 = 1;
    }
    std::ifstream::~ifstream(&ifs);
    goto LAB_001039cc;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
  std::operator<<((ostream *)&ifs,"Cannot set translation mode");
  std::__cxx11::string::string((string *)&error_message_5,"dmp",(allocator *)&local_418);
  sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
  goto LAB_001039b2;
switchD_00103615_caseD_6d:
  std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_5);
  bVar2 = sptk::ConvertStringToInteger((string *)&ifs,&maximum_index);
  bVar12 = maximum_index < 0;
  std::__cxx11::string::~string((string *)&ifs);
  uVar1 = 0;
  if (!bVar2 || bVar12) goto LAB_001036fc;
  goto LAB_001035ec;
LAB_001036fc:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
  poVar5 = std::operator<<((ostream *)&ifs,"The argument for the -m option must be a ");
  std::operator<<(poVar5,"non-negative integer");
  std::__cxx11::string::string((string *)&error_message_5,"dmp",(allocator *)&local_418);
  sptk::PrintErrorMessage((string *)&error_message_5,(ostringstream *)&ifs);
LAB_001039b2:
  std::__cxx11::string::~string((string *)&error_message_5);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
LAB_001039c9:
  uVar7 = 1;
LAB_001039cc:
  std::__cxx11::string::~string((string *)&data_type);
  std::__cxx11::string::~string((string *)&print_format);
  return uVar7;
}

Assistant:

int main(int argc, char* argv[]) {
  int minimum_index(0);
  int maximum_index(kMagicNumberForEndOfFile);
  std::string print_format("");
  std::string data_type(kDefaultDataType);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:f:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &maximum_index) ||
            maximum_index <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("dmp", error_message);
          return 1;
        }
        minimum_index = 1;
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &maximum_index) ||
            maximum_index < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("dmp", error_message);
          return 1;
        }
        minimum_index = 0;
        break;
      }
      case 'f': {
        print_format = optarg;
        if ("%" != print_format.substr(0, 1)) {
          std::ostringstream error_message;
          error_message << "The argument for the -f option must be begin with "
                        << "%";
          sptk::PrintErrorMessage("dmp", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const char* input_file(NULL);
  for (int i(argc - optind); 1 <= i; --i) {
    const char* arg(argv[argc - i]);
    if (0 == std::strncmp(arg, "+", 1)) {
      const std::string str(arg);
      data_type = str.substr(1, std::string::npos);
    } else if (NULL == input_file) {
      input_file = arg;
    } else {
      std::ostringstream error_message;
      error_message << "Too many input files";
      sptk::PrintErrorMessage("dmp", error_message);
      return 1;
    }
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("dmp", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("dmp", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  DataDumpWrapper data_dump(data_type, print_format, minimum_index,
                            maximum_index);

  if (!data_dump.IsValid()) {
    std::ostringstream error_message;
    error_message << "Unexpected argument for the +type option";
    sptk::PrintErrorMessage("dmp", error_message);
    return 1;
  }

  if (!data_dump.Run(&input_stream)) {
    std::ostringstream error_message;
    error_message << "Failed to dump";
    sptk::PrintErrorMessage("dmp", error_message);
    return 1;
  }

  return 0;
}